

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O0

void Hacl_Bignum64_mod_inv_prime_vartime_precomp
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,uint64_t *a,uint64_t *res)

{
  ulong uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  long lVar5;
  undefined8 n;
  uint64_t r2;
  uint32_t len;
  long *__s;
  uint32_t bBits;
  long alStack_1f0 [4];
  long *local_1d0;
  uint64_t *local_1c8;
  uint64_t c10;
  uint64_t *res_i_1;
  uint64_t t1_1;
  long *plStack_1a8;
  uint32_t i_1;
  uint64_t *res_i;
  uint64_t t12;
  uint64_t *res_i2;
  uint64_t t11;
  uint64_t *res_i1;
  uint64_t t10;
  uint64_t *res_i0;
  uint64_t t1;
  uint64_t *puStack_160;
  uint32_t i;
  uint64_t c;
  uint64_t *res1;
  uint64_t *a1;
  uint64_t c1;
  uint64_t c0;
  unsigned_long __vla_expr0;
  undefined8 local_128;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k1;
  uint uStack_100;
  uint32_t len1;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k10;
  uint64_t *res_local;
  uint64_t *a_local;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k_local;
  
  __vla_expr0 = (unsigned_long)(alStack_1f0 + 3);
  uVar1 = *(ulong *)k;
  uStack_100 = (uint)uVar1;
  k1.r2._4_4_ = uStack_100;
  local_128 = *(undefined8 *)k;
  k1._0_8_ = k->n;
  k1.n = (uint64_t *)k->mu;
  k1.mu = (uint64_t)k->r2;
  if (0x1fffffffffffffff < (uVar1 & 0xffffffff)) {
    alStack_1f0[2] = 0x2ecc8f;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum64.c"
           ,0x237);
    alStack_1f0[2] = 0x2ecc99;
    exit(0xfd);
  }
  c0 = uVar1 & 0xffffffff;
  lVar5 = -(c0 * 8 + 0xf & 0xfffffffffffffff0);
  __s = (long *)((long)alStack_1f0 + lVar5 + 0x18);
  local_1d0 = __s;
  *(undefined8 *)((long)alStack_1f0 + lVar5 + 0x10) = 0x2ecce1;
  memset(__s,0,(uVar1 & 0xffffffff) << 3);
  uVar1 = *(ulong *)k1._0_8_;
  *local_1d0 = uVar1 - 2;
  c1 = (uint64_t)(uVar1 < 2);
  if (k1.r2._4_4_ < 2) {
    a1 = (uint64_t *)c1;
  }
  else {
    res1 = (uint64_t *)(k1._0_8_ + 8);
    c = (uint64_t)(local_1d0 + 1);
    puStack_160 = (uint64_t *)c1;
    for (t1._4_4_ = 0; t1._4_4_ < k1.r2._4_4_ - 1 >> 2; t1._4_4_ = t1._4_4_ + 1) {
      puVar2 = (uint64_t *)res1[t1._4_4_ << 2];
      res_i0 = puVar2;
      t10 = c + (ulong)(t1._4_4_ << 2) * 8;
      puVar4 = (uint64_t *)(ulong)((char)puStack_160 != '\0');
      *(long *)t10 = (long)puVar2 - (long)puVar4;
      puVar3 = (uint64_t *)res1[t1._4_4_ * 4 + 1];
      res_i1 = puVar3;
      t11 = c + (ulong)(t1._4_4_ << 2) * 8 + 8;
      puVar4 = (uint64_t *)(ulong)(puVar2 < puVar4);
      *(long *)t11 = (long)puVar3 - (long)puVar4;
      puVar2 = (uint64_t *)res1[t1._4_4_ * 4 + 2];
      res_i2 = puVar2;
      t12 = c + (ulong)(t1._4_4_ << 2) * 8 + 0x10;
      puVar4 = (uint64_t *)(ulong)(puVar3 < puVar4);
      *(long *)t12 = (long)puVar2 - (long)puVar4;
      puVar3 = (uint64_t *)res1[t1._4_4_ * 4 + 3];
      res_i = puVar3;
      plStack_1a8 = (long *)(c + (ulong)(t1._4_4_ << 2) * 8 + 0x18);
      puVar2 = (uint64_t *)(ulong)(puVar2 < puVar4);
      *plStack_1a8 = (long)puVar3 - (long)puVar2;
      puStack_160 = (uint64_t *)(ulong)(puVar3 < puVar2);
    }
    for (t1_1._4_4_ = k1.r2._4_4_ - 1 & 0xfffffffc; t1_1._4_4_ < k1.r2._4_4_ - 1;
        t1_1._4_4_ = t1_1._4_4_ + 1) {
      puVar2 = (uint64_t *)res1[t1_1._4_4_];
      res_i_1 = puVar2;
      c10 = c + (ulong)t1_1._4_4_ * 8;
      puVar3 = (uint64_t *)(ulong)((char)puStack_160 != '\0');
      *(long *)c10 = (long)puVar2 - (long)puVar3;
      puStack_160 = (uint64_t *)(ulong)(puVar2 < puVar3);
    }
    local_1c8 = puStack_160;
    a1 = puStack_160;
  }
  len = k1.r2._4_4_;
  r2 = k1.mu;
  puVar2 = k1.n;
  n = k1._0_8_;
  bBits = k1.r2._4_4_ << 6;
  *(long **)((long)alStack_1f0 + lVar5 + 8) = local_1d0;
  *(uint64_t **)((long)alStack_1f0 + lVar5 + 0x10) = res;
  *(undefined8 *)((long)alStack_1f0 + lVar5) = 0x2ed162;
  Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64
            (len,(uint64_t *)n,(uint64_t)puVar2,(uint64_t *)r2,a,bBits,
             *(uint64_t **)((long)alStack_1f0 + lVar5 + 8),
             *(uint64_t **)((long)alStack_1f0 + lVar5 + 0x10));
  return;
}

Assistant:

void
Hacl_Bignum64_mod_inv_prime_vartime_precomp(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,
  uint64_t *a,
  uint64_t *res
)
{
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k10 = *k;
  uint32_t len1 = k10.len;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint64_t), len1);
  uint64_t n2[len1];
  memset(n2, 0U, len1 * sizeof (uint64_t));
  uint64_t c0 = Lib_IntTypes_Intrinsics_sub_borrow_u64(0ULL, k1.n[0U], 2ULL, n2);
  uint64_t c1;
  if (1U < len1)
  {
    uint64_t *a1 = k1.n + 1U;
    uint64_t *res1 = n2 + 1U;
    uint64_t c = c0;
    for (uint32_t i = 0U; i < (len1 - 1U) / 4U; i++)
    {
      uint64_t t1 = a1[4U * i];
      uint64_t *res_i0 = res1 + 4U * i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t1, 0ULL, res_i0);
      uint64_t t10 = a1[4U * i + 1U];
      uint64_t *res_i1 = res1 + 4U * i + 1U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t10, 0ULL, res_i1);
      uint64_t t11 = a1[4U * i + 2U];
      uint64_t *res_i2 = res1 + 4U * i + 2U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t11, 0ULL, res_i2);
      uint64_t t12 = a1[4U * i + 3U];
      uint64_t *res_i = res1 + 4U * i + 3U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t12, 0ULL, res_i);
    }
    for (uint32_t i = (len1 - 1U) / 4U * 4U; i < len1 - 1U; i++)
    {
      uint64_t t1 = a1[i];
      uint64_t *res_i = res1 + i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u64(c, t1, 0ULL, res_i);
    }
    uint64_t c10 = c;
    c1 = c10;
  }
  else
  {
    c1 = c0;
  }
  KRML_MAYBE_UNUSED_VAR(c1);
  Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64(len1,
    k1.n,
    k1.mu,
    k1.r2,
    a,
    64U * len1,
    n2,
    res);
}